

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection_segment.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnDataCollectionSegment::AllocateNewChunk(ColumnDataCollectionSegment *this)

{
  reference type;
  idx_t i;
  ulong __n;
  VectorDataIndex vector_idx;
  ChunkMetaData local_88;
  
  local_88.block_ids._M_h._M_buckets = &local_88.block_ids._M_h._M_single_bucket;
  local_88.vector_data.
  super_vector<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>.
  super__Vector_base<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.vector_data.
  super_vector<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>.
  super__Vector_base<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.vector_data.
  super_vector<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>.
  super__Vector_base<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.block_ids._M_h._M_bucket_count = 1;
  local_88.block_ids._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_88.block_ids._M_h._M_element_count = 0;
  local_88.block_ids._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_88.block_ids._M_h._M_rehash_policy._M_next_resize = 0;
  local_88.block_ids._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_88.count = 0;
  ::std::vector<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>::reserve
            ((vector<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_> *)&local_88,
             ((long)(this->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x18);
  for (__n = 0; __n < (ulong)(((long)(this->types).
                                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                     .
                                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->types).
                                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    .
                                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x18);
      __n = __n + 1) {
    type = vector<duckdb::LogicalType,_true>::get<true>(&this->types,__n);
    vector_idx = AllocateVector(this,type,&local_88,(ChunkManagementState *)0x0,
                                (VectorDataIndex)0xffffffffffffffff);
    ::std::vector<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>::push_back
              ((vector<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_> *)
               &local_88,&vector_idx);
  }
  ::std::vector<duckdb::ChunkMetaData,_std::allocator<duckdb::ChunkMetaData>_>::
  emplace_back<duckdb::ChunkMetaData>
            (&(this->chunk_data).
              super_vector<duckdb::ChunkMetaData,_std::allocator<duckdb::ChunkMetaData>_>,&local_88)
  ;
  ChunkMetaData::~ChunkMetaData(&local_88);
  return;
}

Assistant:

void ColumnDataCollectionSegment::AllocateNewChunk() {
	ChunkMetaData meta_data;
	meta_data.count = 0;
	meta_data.vector_data.reserve(types.size());
	for (idx_t i = 0; i < types.size(); i++) {
		auto vector_idx = AllocateVector(types[i], meta_data);
		meta_data.vector_data.push_back(vector_idx);
	}
	chunk_data.push_back(std::move(meta_data));
}